

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipm.cc
# Opt level: O1

void __thiscall ipx::IPM::AddCorrector(IPM *this,Step *step)

{
  double dVar1;
  double dVar2;
  Iterate *this_00;
  pointer pSVar3;
  double *pdVar4;
  double *pdVar5;
  double *rl;
  uint uVar6;
  double *sl;
  double *pdVar7;
  Vector *pVVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  
  this_00 = this->iterate_;
  iVar13 = this_00->model_->num_rows_;
  iVar12 = this_00->model_->num_cols_;
  dVar15 = Iterate::mu(this_00);
  dVar16 = 1.0;
  dVar18 = 1.0;
  uVar6 = (uint)(this_00->xl_)._M_size;
  if (0 < (int)uVar6) {
    uVar9 = 0;
    dVar18 = 1.0;
    do {
      dVar17 = (this_00->xl_)._M_data[uVar9];
      dVar19 = (step->xl)._M_data[uVar9];
      uVar14 = -(ulong)(dVar18 * dVar19 + dVar17 < 0.0);
      dVar18 = (double)(~uVar14 & (ulong)dVar18 |
                       (ulong)((dVar17 * -0.9999999999999998) / dVar19) & uVar14);
      uVar9 = uVar9 + 1;
    } while ((uVar6 & 0x7fffffff) != uVar9);
  }
  dVar17 = 1.0;
  uVar6 = (uint)(this_00->xu_)._M_size;
  if (0 < (int)uVar6) {
    uVar9 = 0;
    dVar17 = 1.0;
    do {
      dVar19 = (this_00->xu_)._M_data[uVar9];
      dVar1 = (step->xu)._M_data[uVar9];
      uVar14 = -(ulong)(dVar17 * dVar1 + dVar19 < 0.0);
      dVar17 = (double)(~uVar14 & (ulong)dVar17 |
                       (ulong)((dVar19 * -0.9999999999999998) / dVar1) & uVar14);
      uVar9 = uVar9 + 1;
    } while ((uVar6 & 0x7fffffff) != uVar9);
  }
  dVar19 = 1.0;
  uVar6 = (uint)(this_00->zl_)._M_size;
  if (0 < (int)uVar6) {
    uVar9 = 0;
    dVar19 = 1.0;
    do {
      dVar1 = (this_00->zl_)._M_data[uVar9];
      dVar2 = (step->zl)._M_data[uVar9];
      uVar14 = -(ulong)(dVar19 * dVar2 + dVar1 < 0.0);
      dVar19 = (double)(~uVar14 & (ulong)dVar19 |
                       (ulong)((dVar1 * -0.9999999999999998) / dVar2) & uVar14);
      uVar9 = uVar9 + 1;
    } while ((uVar6 & 0x7fffffff) != uVar9);
  }
  uVar6 = (uint)(this_00->zu_)._M_size;
  if (0 < (int)uVar6) {
    uVar9 = 0;
    dVar16 = 1.0;
    do {
      dVar1 = (this_00->zu_)._M_data[uVar9];
      dVar2 = (step->zu)._M_data[uVar9];
      uVar14 = -(ulong)(dVar16 * dVar2 + dVar1 < 0.0);
      dVar16 = (double)(~uVar14 & (ulong)dVar16 |
                       (ulong)((dVar1 * -0.9999999999999998) / dVar2) & uVar14);
      uVar9 = uVar9 + 1;
    } while ((uVar6 & 0x7fffffff) != uVar9);
  }
  uVar14 = (long)iVar12 + (long)iVar13;
  iVar13 = (int)uVar14;
  uVar9 = uVar14 & 0xffffffff;
  if (iVar13 < 1) {
    dVar18 = NAN;
  }
  else {
    if (dVar18 <= dVar17) {
      dVar17 = dVar18;
    }
    if (dVar19 <= dVar16) {
      dVar16 = dVar19;
    }
    lVar11 = 0;
    dVar18 = 0.0;
    iVar12 = 0;
    do {
      uVar6 = *(uint *)((long)(this->iterate_->variable_state_).
                              super__Vector_base<ipx::Iterate::StateDetail,_std::allocator<ipx::Iterate::StateDetail>_>
                              ._M_impl.super__Vector_impl_data._M_start + lVar11);
      if ((uVar6 & 0xfffffffd) == 0) {
        dVar18 = dVar18 + (*(double *)((long)(step->zl)._M_data + lVar11 * 2) * dVar16 +
                          *(double *)((long)(this_00->zl_)._M_data + lVar11 * 2)) *
                          (*(double *)((long)(step->xl)._M_data + lVar11 * 2) * dVar17 +
                          *(double *)((long)(this_00->xl_)._M_data + lVar11 * 2));
        iVar12 = iVar12 + 1;
      }
      if (uVar6 - 1 < 2) {
        dVar18 = dVar18 + (*(double *)((long)(step->zu)._M_data + lVar11 * 2) * dVar16 +
                          *(double *)((long)(this_00->zu_)._M_data + lVar11 * 2)) *
                          (*(double *)((long)(step->xu)._M_data + lVar11 * 2) * dVar17 +
                          *(double *)((long)(this_00->xu_)._M_data + lVar11 * 2));
        iVar12 = iVar12 + 1;
      }
      lVar11 = lVar11 + 4;
    } while (uVar9 * 4 - lVar11 != 0);
    dVar18 = dVar18 / (double)iVar12;
  }
  dVar18 = dVar18 / dVar15;
  uVar14 = uVar14 * 8;
  sl = (double *)operator_new(uVar14);
  memset(sl,0,uVar14);
  dVar15 = dVar18 * dVar18 * dVar18 * dVar15;
  if (0 < iVar13) {
    pSVar3 = (this->iterate_->variable_state_).
             super__Vector_base<ipx::Iterate::StateDetail,_std::allocator<ipx::Iterate::StateDetail>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pdVar7 = (step->xl)._M_data;
    pdVar4 = (step->zl)._M_data;
    uVar10 = 0;
    do {
      dVar16 = 0.0;
      if ((pSVar3[uVar10] & ~BARRIER_BOXED) == BARRIER_LB) {
        dVar16 = (dVar15 - (this_00->xl_)._M_data[uVar10] * (this_00->zl_)._M_data[uVar10]) -
                 pdVar7[uVar10] * pdVar4[uVar10];
      }
      sl[uVar10] = dVar16;
      uVar10 = uVar10 + 1;
    } while (uVar9 != uVar10);
  }
  pdVar7 = (double *)operator_new(uVar14);
  memset(pdVar7,0,uVar14);
  if (0 < iVar13) {
    pSVar3 = (this->iterate_->variable_state_).
             super__Vector_base<ipx::Iterate::StateDetail,_std::allocator<ipx::Iterate::StateDetail>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pdVar4 = (step->xu)._M_data;
    pdVar5 = (step->zu)._M_data;
    uVar14 = 0;
    do {
      dVar16 = 0.0;
      if (pSVar3[uVar14] - BARRIER_UB < 2) {
        dVar16 = (dVar15 - (this_00->xu_)._M_data[uVar14] * (this_00->zu_)._M_data[uVar14]) -
                 pdVar4[uVar14] * pdVar5[uVar14];
      }
      pdVar7[uVar14] = dVar16;
      uVar14 = uVar14 + 1;
    } while (uVar9 != uVar14);
  }
  pVVar8 = Iterate::rb(this->iterate_);
  pdVar4 = pVVar8->_M_data;
  pVVar8 = Iterate::rc(this->iterate_);
  pdVar5 = pVVar8->_M_data;
  pVVar8 = Iterate::rl(this->iterate_);
  rl = pVVar8->_M_data;
  pVVar8 = Iterate::ru(this->iterate_);
  SolveNewtonSystem(this,pdVar4,pdVar5,rl,pVVar8->_M_data,sl,pdVar7,step);
  operator_delete(pdVar7);
  operator_delete(sl);
  return;
}

Assistant:

void IPM::AddCorrector(Step& step) {
    const Model& model = iterate_->model();
    const Int m = model.rows();
    const Int n = model.cols();
    const Vector& xl = iterate_->xl();
    const Vector& xu = iterate_->xu();
    const Vector& zl = iterate_->zl();
    const Vector& zu = iterate_->zu();
    const Vector& dxl = step.xl;
    const Vector& dxu = step.xu;
    const Vector& dzl = step.zl;
    const Vector& dzu = step.zu;
    const double mu = iterate_->mu();

    // Choose centering parameter.
    double step_xl = StepToBoundary(xl, dxl, nullptr);
    double step_xu = StepToBoundary(xu, dxu, nullptr);
    double step_zl = StepToBoundary(zl, dzl, nullptr);
    double step_zu = StepToBoundary(zu, dzu, nullptr);
    double maxp = std::min(step_xl, step_xu);
    double maxd = std::min(step_zl, step_zu);
    double muaff = 0.0;
    Int num_finite = 0;
    for (Int j = 0; j < n+m; j++) {
        if (iterate_->has_barrier_lb(j)) {
            assert(std::isfinite(xl[j]));
            assert(xl[j] != 0.0);
            muaff += (xl[j]+maxp*dxl[j]) * (zl[j]+maxd*dzl[j]);
            num_finite++;
        }
        if (iterate_->has_barrier_ub(j)) {
            assert(std::isfinite(xu[j]));
            assert(xu[j] != 0.0);
            muaff += (xu[j]+maxp*dxu[j]) * (zu[j]+maxd*dzu[j]);
            num_finite++;
        }
    }
    assert(std::isfinite(muaff));
    muaff /= num_finite;
    double ratio = muaff / mu;
    double sigma = ratio * ratio * ratio;

    // sl = -xl.*zl + sigma*mu - dxl.*dzl
    Vector sl(n+m);
    for (Int j = 0; j < n+m; j++)
        if (iterate_->has_barrier_lb(j))
            sl[j] = -xl[j]*zl[j] + sigma*mu - dxl[j]*dzl[j];
        else
            sl[j] = 0.0;
    assert(AllFinite(sl));

    // su = -xu.*zu + sigma*mu - dxu.*dzu
    Vector su(n+m);
    for (Int j = 0; j < n+m; j++)
        if (iterate_->has_barrier_ub(j))
            su[j] = -xu[j]*zu[j] + sigma*mu - dxu[j]*dzu[j];
        else
            su[j] = 0.0;
    assert(AllFinite(su));

    SolveNewtonSystem(&iterate_->rb()[0], &iterate_->rc()[0],
                      &iterate_->rl()[0], &iterate_->ru()[0], &sl[0], &su[0],
                      step);
}